

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

void bench_sign_setup(void *arg)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [16];
  long lVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  undefined1 auVar25 [16];
  char cVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar49;
  short sVar50;
  undefined1 auVar58 [16];
  short sVar59;
  short sVar60;
  undefined1 auVar65 [12];
  undefined1 auVar70 [16];
  undefined4 uVar72;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  long lVar34;
  undefined4 uVar51;
  undefined6 uVar52;
  undefined8 uVar53;
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined4 uVar61;
  undefined6 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar71 [16];
  undefined6 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [12];
  undefined1 auVar76 [14];
  undefined1 auVar79 [16];
  
  auVar22 = _DAT_00105090;
  lVar23 = 0;
  auVar25 = _DAT_00105010;
  auVar42 = _DAT_00105020;
  auVar43 = _DAT_00105030;
  auVar44 = _DAT_00105040;
  auVar45 = _DAT_00105050;
  auVar46 = _DAT_00105060;
  auVar47 = _DAT_00105070;
  auVar48 = _DAT_00105080;
  do {
    auVar58 = auVar48 & auVar22;
    auVar70 = auVar47 & auVar22;
    sVar10 = auVar58._0_2_;
    cVar32 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0] - (0xff < sVar10);
    sVar10 = auVar58._2_2_;
    sVar49 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar58[2] - (0xff < sVar10),cVar32);
    sVar10 = auVar58._4_2_;
    cVar24 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[4] - (0xff < sVar10);
    sVar10 = auVar58._6_2_;
    uVar51 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar58[6] - (0xff < sVar10),
                      CONCAT12(cVar24,sVar49));
    sVar10 = auVar58._8_2_;
    cVar26 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[8] - (0xff < sVar10);
    sVar10 = auVar58._10_2_;
    uVar52 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar58[10] - (0xff < sVar10),
                      CONCAT14(cVar26,uVar51));
    sVar10 = auVar58._12_2_;
    cVar27 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0xc] - (0xff < sVar10);
    sVar10 = auVar58._14_2_;
    uVar53 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar58[0xe] - (0xff < sVar10),
                      CONCAT16(cVar27,uVar52));
    sVar10 = auVar70._0_2_;
    cVar28 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0] - (0xff < sVar10);
    sVar10 = auVar70._2_2_;
    auVar54._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar70[2] - (0xff < sVar10),
                  CONCAT18(cVar28,uVar53));
    sVar10 = auVar70._4_2_;
    cVar29 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[4] - (0xff < sVar10);
    auVar54[10] = cVar29;
    sVar10 = auVar70._6_2_;
    auVar54[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar70[6] - (0xff < sVar10);
    sVar10 = auVar70._8_2_;
    cVar30 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[8] - (0xff < sVar10);
    auVar56[0xc] = cVar30;
    auVar56._0_12_ = auVar54;
    sVar10 = auVar70._10_2_;
    auVar56[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar70[10] - (0xff < sVar10);
    sVar10 = auVar70._12_2_;
    cVar31 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0xc] - (0xff < sVar10);
    auVar58[0xe] = cVar31;
    auVar58._0_14_ = auVar56;
    sVar10 = auVar70._14_2_;
    auVar58[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0xe] - (0xff < sVar10);
    auVar70 = auVar46 & auVar22;
    auVar77 = auVar45 & auVar22;
    sVar10 = auVar70._0_2_;
    cVar41 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0] - (0xff < sVar10);
    sVar10 = auVar70._2_2_;
    sVar59 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar70[2] - (0xff < sVar10),cVar41);
    sVar10 = auVar70._4_2_;
    cVar40 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[4] - (0xff < sVar10);
    sVar10 = auVar70._6_2_;
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar70[6] - (0xff < sVar10),
                      CONCAT12(cVar40,sVar59));
    sVar10 = auVar70._8_2_;
    cVar33 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[8] - (0xff < sVar10);
    sVar10 = auVar70._10_2_;
    uVar62 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar70[10] - (0xff < sVar10),
                      CONCAT14(cVar33,uVar61));
    sVar10 = auVar70._12_2_;
    cVar39 = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0xc] - (0xff < sVar10);
    sVar10 = auVar70._14_2_;
    uVar63 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar70[0xe] - (0xff < sVar10),
                      CONCAT16(cVar39,uVar62));
    sVar10 = auVar77._0_2_;
    cVar38 = (0 < sVar10) * (sVar10 < 0x100) * auVar77[0] - (0xff < sVar10);
    sVar10 = auVar77._2_2_;
    auVar64._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar77[2] - (0xff < sVar10),
                  CONCAT18(cVar38,uVar63));
    sVar10 = auVar77._4_2_;
    cVar37 = (0 < sVar10) * (sVar10 < 0x100) * auVar77[4] - (0xff < sVar10);
    auVar64[10] = cVar37;
    sVar10 = auVar77._6_2_;
    auVar64[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar77[6] - (0xff < sVar10);
    sVar10 = auVar77._8_2_;
    cVar36 = (0 < sVar10) * (sVar10 < 0x100) * auVar77[8] - (0xff < sVar10);
    auVar67[0xc] = cVar36;
    auVar67._0_12_ = auVar64;
    sVar10 = auVar77._10_2_;
    auVar67[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar77[10] - (0xff < sVar10);
    sVar10 = auVar77._12_2_;
    cVar35 = (0 < sVar10) * (sVar10 < 0x100) * auVar77[0xc] - (0xff < sVar10);
    auVar78[0xe] = cVar35;
    auVar78._0_14_ = auVar67;
    sVar10 = auVar77._14_2_;
    auVar78[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar77[0xe] - (0xff < sVar10);
    cVar2 = (0 < sVar49) * (sVar49 < 0x100) * cVar32 - (0xff < sVar49);
    sVar10 = (short)((uint)uVar51 >> 0x10);
    sVar50 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar24 - (0xff < sVar10),cVar2);
    sVar10 = (short)((uint6)uVar52 >> 0x20);
    cVar32 = (0 < sVar10) * (sVar10 < 0x100) * cVar26 - (0xff < sVar10);
    sVar10 = (short)((ulong)uVar53 >> 0x30);
    uVar51 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar27 - (0xff < sVar10),
                      CONCAT12(cVar32,sVar50));
    sVar10 = (short)((unkuint10)auVar54._0_10_ >> 0x40);
    cVar24 = (0 < sVar10) * (sVar10 < 0x100) * cVar28 - (0xff < sVar10);
    sVar10 = auVar54._10_2_;
    uVar52 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * cVar29 - (0xff < sVar10),
                      CONCAT14(cVar24,uVar51));
    sVar10 = auVar56._12_2_;
    cVar30 = (0 < sVar10) * (sVar10 < 0x100) * cVar30 - (0xff < sVar10);
    sVar10 = auVar58._14_2_;
    uVar53 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar31 - (0xff < sVar10),
                      CONCAT16(cVar30,uVar52));
    cVar29 = (0 < sVar59) * (sVar59 < 0x100) * cVar41 - (0xff < sVar59);
    sVar10 = (short)((uint)uVar61 >> 0x10);
    auVar55._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar40 - (0xff < sVar10),CONCAT18(cVar29,uVar53)
                 );
    sVar10 = (short)((uint6)uVar62 >> 0x20);
    cVar28 = (0 < sVar10) * (sVar10 < 0x100) * cVar33 - (0xff < sVar10);
    auVar55[10] = cVar28;
    sVar10 = (short)((ulong)uVar63 >> 0x30);
    auVar55[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar39 - (0xff < sVar10);
    sVar10 = (short)((unkuint10)auVar64._0_10_ >> 0x40);
    cVar27 = (0 < sVar10) * (sVar10 < 0x100) * cVar38 - (0xff < sVar10);
    auVar57[0xc] = cVar27;
    auVar57._0_12_ = auVar55;
    sVar10 = auVar64._10_2_;
    auVar57[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar37 - (0xff < sVar10);
    sVar10 = auVar67._12_2_;
    cVar26 = (0 < sVar10) * (sVar10 < 0x100) * cVar36 - (0xff < sVar10);
    auVar70[0xe] = cVar26;
    auVar70._0_14_ = auVar57;
    sVar10 = auVar78._14_2_;
    auVar70[0xf] = (0 < sVar10) * (sVar10 < 0x100) * cVar35 - (0xff < sVar10);
    auVar58 = auVar44 & auVar22;
    auVar78 = auVar43 & auVar22;
    sVar10 = auVar58._0_2_;
    cVar31 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0] - (0xff < sVar10);
    sVar10 = auVar58._2_2_;
    sVar49 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar58[2] - (0xff < sVar10),cVar31);
    sVar10 = auVar58._4_2_;
    cVar33 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[4] - (0xff < sVar10);
    sVar10 = auVar58._6_2_;
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar58[6] - (0xff < sVar10),
                      CONCAT12(cVar33,sVar49));
    sVar10 = auVar58._8_2_;
    cVar35 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[8] - (0xff < sVar10);
    sVar10 = auVar58._10_2_;
    uVar62 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar58[10] - (0xff < sVar10),
                      CONCAT14(cVar35,uVar61));
    sVar10 = auVar58._12_2_;
    cVar36 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0xc] - (0xff < sVar10);
    sVar10 = auVar58._14_2_;
    uVar63 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar58[0xe] - (0xff < sVar10),
                      CONCAT16(cVar36,uVar62));
    sVar10 = auVar78._0_2_;
    cVar37 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0] - (0xff < sVar10);
    sVar10 = auVar78._2_2_;
    auVar65._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar78[2] - (0xff < sVar10),
                  CONCAT18(cVar37,uVar63));
    sVar10 = auVar78._4_2_;
    cVar38 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[4] - (0xff < sVar10);
    auVar65[10] = cVar38;
    sVar10 = auVar78._6_2_;
    auVar65[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[6] - (0xff < sVar10);
    sVar10 = auVar78._8_2_;
    cVar39 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[8] - (0xff < sVar10);
    auVar68[0xc] = cVar39;
    auVar68._0_12_ = auVar65;
    sVar10 = auVar78._10_2_;
    auVar68[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[10] - (0xff < sVar10);
    sVar10 = auVar78._12_2_;
    cVar40 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0xc] - (0xff < sVar10);
    auVar77[0xe] = cVar40;
    auVar77._0_14_ = auVar68;
    sVar10 = auVar78._14_2_;
    auVar77[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0xe] - (0xff < sVar10);
    auVar58 = auVar42 & auVar22;
    auVar78 = auVar25 & auVar22;
    sVar10 = auVar58._0_2_;
    cVar41 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0] - (0xff < sVar10);
    sVar10 = auVar58._2_2_;
    sVar59 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar58[2] - (0xff < sVar10),cVar41);
    sVar10 = auVar58._4_2_;
    cVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[4] - (0xff < sVar10);
    sVar10 = auVar58._6_2_;
    uVar72 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar58[6] - (0xff < sVar10),
                      CONCAT12(cVar3,sVar59));
    sVar10 = auVar58._8_2_;
    cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[8] - (0xff < sVar10);
    sVar10 = auVar58._10_2_;
    uVar73 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar58[10] - (0xff < sVar10),
                      CONCAT14(cVar4,uVar72));
    sVar10 = auVar58._12_2_;
    cVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar58[0xc] - (0xff < sVar10);
    sVar10 = auVar58._14_2_;
    uVar74 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar58[0xe] - (0xff < sVar10),
                      CONCAT16(cVar5,uVar73));
    sVar10 = auVar78._0_2_;
    cVar6 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0] - (0xff < sVar10);
    sVar10 = auVar78._2_2_;
    auVar75._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar78[2] - (0xff < sVar10),
                  CONCAT18(cVar6,uVar74));
    sVar10 = auVar78._4_2_;
    cVar7 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[4] - (0xff < sVar10);
    auVar75[10] = cVar7;
    sVar10 = auVar78._6_2_;
    auVar75[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[6] - (0xff < sVar10);
    sVar10 = auVar78._8_2_;
    cVar8 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[8] - (0xff < sVar10);
    auVar76[0xc] = cVar8;
    auVar76._0_12_ = auVar75;
    sVar10 = auVar78._10_2_;
    auVar76[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[10] - (0xff < sVar10);
    sVar10 = auVar78._12_2_;
    cVar9 = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0xc] - (0xff < sVar10);
    auVar79[0xe] = cVar9;
    auVar79._0_14_ = auVar76;
    sVar10 = auVar78._14_2_;
    auVar79[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar78[0xe] - (0xff < sVar10);
    cVar31 = (0 < sVar49) * (sVar49 < 0x100) * cVar31 - (0xff < sVar49);
    sVar10 = (short)((uint)uVar61 >> 0x10);
    sVar60 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar33 - (0xff < sVar10),cVar31);
    sVar10 = (short)((uint6)uVar62 >> 0x20);
    cVar33 = (0 < sVar10) * (sVar10 < 0x100) * cVar35 - (0xff < sVar10);
    sVar10 = (short)((ulong)uVar63 >> 0x30);
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar36 - (0xff < sVar10),
                      CONCAT12(cVar33,sVar60));
    sVar10 = (short)((unkuint10)auVar65._0_10_ >> 0x40);
    cVar35 = (0 < sVar10) * (sVar10 < 0x100) * cVar37 - (0xff < sVar10);
    sVar10 = auVar65._10_2_;
    uVar62 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * cVar38 - (0xff < sVar10),
                      CONCAT14(cVar35,uVar61));
    sVar10 = auVar68._12_2_;
    cVar36 = (0 < sVar10) * (sVar10 < 0x100) * cVar39 - (0xff < sVar10);
    sVar10 = auVar77._14_2_;
    uVar63 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar40 - (0xff < sVar10),
                      CONCAT16(cVar36,uVar62));
    cVar37 = (0 < sVar59) * (sVar59 < 0x100) * cVar41 - (0xff < sVar59);
    sVar10 = (short)((uint)uVar72 >> 0x10);
    auVar66._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10),CONCAT18(cVar37,uVar63))
    ;
    sVar10 = (short)((uint6)uVar73 >> 0x20);
    cVar38 = (0 < sVar10) * (sVar10 < 0x100) * cVar4 - (0xff < sVar10);
    auVar66[10] = cVar38;
    sVar10 = (short)((ulong)uVar74 >> 0x30);
    auVar66[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
    sVar10 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
    cVar39 = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
    auVar69[0xc] = cVar39;
    auVar69._0_12_ = auVar66;
    sVar10 = auVar75._10_2_;
    auVar69[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10);
    sVar10 = auVar76._12_2_;
    cVar40 = (0 < sVar10) * (sVar10 < 0x100) * cVar8 - (0xff < sVar10);
    auVar71[0xe] = cVar40;
    auVar71._0_14_ = auVar69;
    sVar10 = auVar79._14_2_;
    auVar71[0xf] = (0 < sVar10) * (sVar10 < 0x100) * cVar9 - (0xff < sVar10);
    sVar10 = (short)((uint)uVar51 >> 0x10);
    sVar49 = (short)((uint6)uVar52 >> 0x20);
    sVar59 = (short)((ulong)uVar53 >> 0x30);
    sVar11 = (short)((unkuint10)auVar55._0_10_ >> 0x40);
    sVar12 = auVar55._10_2_;
    sVar13 = auVar57._12_2_;
    sVar14 = auVar70._14_2_;
    sVar15 = (short)((uint)uVar61 >> 0x10);
    sVar16 = (short)((uint6)uVar62 >> 0x20);
    sVar17 = (short)((ulong)uVar63 >> 0x30);
    sVar18 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar19 = auVar66._10_2_;
    sVar20 = auVar69._12_2_;
    sVar21 = auVar71._14_2_;
    pcVar1 = (char *)((long)arg + lVar23 + 8);
    *pcVar1 = ((0 < sVar50) * (sVar50 < 0x100) * cVar2 - (0xff < sVar50)) + '\x01';
    pcVar1[1] = ((0 < sVar10) * (sVar10 < 0x100) * cVar32 - (0xff < sVar10)) + '\x01';
    pcVar1[2] = ((0 < sVar49) * (sVar49 < 0x100) * cVar24 - (0xff < sVar49)) + '\x01';
    pcVar1[3] = ((0 < sVar59) * (sVar59 < 0x100) * cVar30 - (0xff < sVar59)) + '\x01';
    pcVar1[4] = ((0 < sVar11) * (sVar11 < 0x100) * cVar29 - (0xff < sVar11)) + '\x01';
    pcVar1[5] = ((0 < sVar12) * (sVar12 < 0x100) * cVar28 - (0xff < sVar12)) + '\x01';
    pcVar1[6] = ((0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13)) + '\x01';
    pcVar1[7] = ((0 < sVar14) * (sVar14 < 0x100) * cVar26 - (0xff < sVar14)) + '\x01';
    pcVar1[8] = ((0 < sVar60) * (sVar60 < 0x100) * cVar31 - (0xff < sVar60)) + '\x01';
    pcVar1[9] = ((0 < sVar15) * (sVar15 < 0x100) * cVar33 - (0xff < sVar15)) + '\x01';
    pcVar1[10] = ((0 < sVar16) * (sVar16 < 0x100) * cVar35 - (0xff < sVar16)) + '\x01';
    pcVar1[0xb] = ((0 < sVar17) * (sVar17 < 0x100) * cVar36 - (0xff < sVar17)) + '\x01';
    pcVar1[0xc] = ((0 < sVar18) * (sVar18 < 0x100) * cVar37 - (0xff < sVar18)) + '\x01';
    pcVar1[0xd] = ((0 < sVar19) * (sVar19 < 0x100) * cVar38 - (0xff < sVar19)) + '\x01';
    pcVar1[0xe] = ((0 < sVar20) * (sVar20 < 0x100) * cVar39 - (0xff < sVar20)) + '\x01';
    pcVar1[0xf] = ((0 < sVar21) * (sVar21 < 0x100) * cVar40 - (0xff < sVar21)) + '\x01';
    lVar23 = lVar23 + 0x10;
    lVar34 = auVar48._8_8_;
    auVar48._0_8_ = auVar48._0_8_ + 0x10;
    auVar48._8_8_ = lVar34 + 0x10;
    lVar34 = auVar47._8_8_;
    auVar47._0_8_ = auVar47._0_8_ + 0x10;
    auVar47._8_8_ = lVar34 + 0x10;
    lVar34 = auVar46._8_8_;
    auVar46._0_8_ = auVar46._0_8_ + 0x10;
    auVar46._8_8_ = lVar34 + 0x10;
    lVar34 = auVar45._8_8_;
    auVar45._0_8_ = auVar45._0_8_ + 0x10;
    auVar45._8_8_ = lVar34 + 0x10;
    lVar34 = auVar44._8_8_;
    auVar44._0_8_ = auVar44._0_8_ + 0x10;
    auVar44._8_8_ = lVar34 + 0x10;
    lVar34 = auVar43._8_8_;
    auVar43._0_8_ = auVar43._0_8_ + 0x10;
    auVar43._8_8_ = lVar34 + 0x10;
    lVar34 = auVar42._8_8_;
    auVar42._0_8_ = auVar42._0_8_ + 0x10;
    auVar42._8_8_ = lVar34 + 0x10;
    lVar34 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 0x10;
    auVar25._8_8_ = lVar34 + 0x10;
  } while (lVar23 != 0x20);
  cVar24 = '\0';
  cVar26 = '\x01';
  cVar27 = '\x02';
  cVar28 = '\x03';
  cVar29 = '\x04';
  cVar30 = '\x05';
  cVar31 = '\x06';
  cVar32 = '\a';
  cVar33 = '\b';
  cVar35 = '\t';
  cVar36 = '\n';
  cVar37 = '\v';
  cVar38 = '\f';
  cVar39 = '\r';
  cVar40 = '\x0e';
  cVar41 = '\x0f';
  lVar23 = 0;
  do {
    pcVar1 = (char *)((long)arg + lVar23 + 0x28);
    *pcVar1 = cVar24 + 'A';
    pcVar1[1] = cVar26 + 'A';
    pcVar1[2] = cVar27 + 'A';
    pcVar1[3] = cVar28 + 'A';
    pcVar1[4] = cVar29 + 'A';
    pcVar1[5] = cVar30 + 'A';
    pcVar1[6] = cVar31 + 'A';
    pcVar1[7] = cVar32 + 'A';
    pcVar1[8] = cVar33 + 'A';
    pcVar1[9] = cVar35 + 'A';
    pcVar1[10] = cVar36 + 'A';
    pcVar1[0xb] = cVar37 + 'A';
    pcVar1[0xc] = cVar38 + 'A';
    pcVar1[0xd] = cVar39 + 'A';
    pcVar1[0xe] = cVar40 + 'A';
    pcVar1[0xf] = cVar41 + 'A';
    lVar23 = lVar23 + 0x10;
    cVar24 = cVar24 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
    cVar41 = cVar41 + '\x10';
  } while (lVar23 != 0x20);
  return;
}

Assistant:

static void bench_sign_setup(void* arg) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < 32; i++) {
        data->msg[i] = i + 1;
    }
    for (i = 0; i < 32; i++) {
        data->key[i] = i + 65;
    }
}